

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
randomx::VmBase<randomx::AlignedAllocator<64UL>,_true>::~VmBase
          (VmBase<randomx::AlignedAllocator<64UL>,_true> *this)

{
  undefined8 *in_RDI;
  void *in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_00151120;
  AlignedAllocator<64UL>::freeMemory(in_stack_ffffffffffffffe8,0x127b02);
  randomx_vm::~randomx_vm((randomx_vm *)0x127b0e);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}